

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O3

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> __thiscall
duckdb::ArrowType::GetTypeFromFormat
          (ArrowType *this,DBConfig *config,ArrowSchema *schema,string *format)

{
  char *pcVar1;
  ArrowSchema *pAVar2;
  long lVar3;
  pointer pcVar4;
  ArrowVariableSizeType AVar5;
  int iVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *index;
  pointer pAVar7;
  reference pvVar8;
  ArrowType *pAVar9;
  NotImplementedException *pNVar10;
  InvalidInputException *pIVar11;
  idx_t iVar12;
  Vector *extraout_RDX;
  ArrowVariableSizeType size_type;
  ulong uVar13;
  pointer *__ptr;
  bool view;
  Vector *args;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_00;
  long lVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  type_ids;
  string parameters;
  LogicalType array_type;
  unsigned_long fixed_size;
  vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> children;
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [8];
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  ArrowListInfo local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 local_118 [8];
  undefined1 local_110 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  shared_ptr<duckdb::ArrowType,_true> local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  LogicalType local_e8;
  LogicalType local_d0;
  child_list_t<LogicalType> local_b8;
  child_list_t<LogicalType> local_a0;
  child_list_t<LogicalType> local_88;
  child_list_t<LogicalType> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GetTypeFromFormat((ArrowType *)local_110,format);
  if (local_110 != (undefined1  [8])0x0) {
    (this->extension_data).internal.
    super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_110;
    return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>)this;
  }
  iVar6 = ::std::__cxx11::string::compare((char *)format);
  if (iVar6 == 0) {
    AVar5 = NORMAL;
LAB_0115ed3c:
    size_type = AVar5;
    view = false;
  }
  else {
    iVar6 = ::std::__cxx11::string::compare((char *)format);
    size_type = SUPER_SIZE;
    AVar5 = SUPER_SIZE;
    if (iVar6 == 0) goto LAB_0115ed3c;
    iVar6 = ::std::__cxx11::string::compare((char *)format);
    view = true;
    if (iVar6 == 0) {
      size_type = NORMAL;
    }
    else {
      iVar6 = ::std::__cxx11::string::compare((char *)format);
      if (iVar6 != 0) {
        pcVar1 = (format->_M_dataplus)._M_p;
        if ((*pcVar1 == '+') && (pcVar1[1] == 'w')) {
          ::std::__cxx11::string::find((char)format,0x3a);
          iVar12 = 0xffffffffffffffff;
          ::std::__cxx11::string::substr((ulong)local_198,(ulong)format);
          iVar6 = ::std::__cxx11::stoi((string *)local_198,(size_t *)0x0,10);
          index = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  NumericCastImpl<unsigned_long,_int,_false>::Convert(iVar6);
          local_158.super_ArrowTypeInfo._vptr_ArrowTypeInfo = (_func_int **)index;
          GetArrowLogicalType((ArrowType *)&local_138,config,*schema->children);
          pAVar7 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::
                   operator->((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                               *)&local_138._M_allocated_capacity);
          GetDuckType((LogicalType *)local_1b8,pAVar7,false);
          optional_idx::optional_idx((optional_idx *)&local_f0,(idx_t)index);
          LogicalType::ARRAY((LogicalType *)local_178,(LogicalType *)local_1b8,
                             (optional_idx)local_f0._M_pi);
          LogicalType::~LogicalType((LogicalType *)local_1b8);
          make_uniq<duckdb::ArrowArrayInfo,duckdb::unique_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,true>,unsigned_long&>
                    ((duckdb *)local_1b8,
                     (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
                     &local_138._M_allocated_capacity,(unsigned_long *)&local_158);
          args = (Vector *)local_178;
          make_uniq<duckdb::ArrowType,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::ArrowArrayInfo,std::default_delete<duckdb::ArrowArrayInfo>,true>>
                    ((duckdb *)this,(LogicalType *)args,
                     (unique_ptr<duckdb::ArrowArrayInfo,_std::default_delete<duckdb::ArrowArrayInfo>,_true>
                      *)local_1b8);
          if ((ClientContext *)local_1b8._0_8_ != (ClientContext *)0x0) {
            (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                         &((ArrowTypeInfo *)local_1b8._0_8_)->_vptr_ArrowTypeInfo)->internal).
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)((ClientContext *)local_1b8._0_8_,args,extraout_RDX,iVar12);
          }
          LogicalType::~LogicalType((LogicalType *)local_178);
          if ((ArrowType *)local_138._M_allocated_capacity != (ArrowType *)0x0) {
            ::std::default_delete<duckdb::ArrowType>::operator()
                      ((default_delete<duckdb::ArrowType> *)local_138._M_local_buf,
                       (ArrowType *)local_138._M_allocated_capacity);
          }
LAB_0115ef70:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._0_8_ != &local_188) {
            operator_delete((void *)local_198._0_8_);
          }
        }
        else {
          iVar6 = ::std::__cxx11::string::compare((char *)format);
          if (iVar6 == 0) {
            local_178._0_8_ = (pointer)0x0;
            local_178._8_8_ = (element_type *)0x0;
            local_168._0_8_ = 0;
            local_1b8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_1b8._0_8_ = (_Head_base<0UL,_duckdb::ArrowArrayInfo_*,_false>)0x0;
            local_1b8._8_8_ = (element_type *)0x0;
            if (schema->n_children == 0) {
              local_158.child.internal.
              super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
              pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_198._0_8_ = &local_188;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_198,
                         "Attempted to convert a STRUCT with no fields to DuckDB which is not supported"
                         ,"");
              InvalidInputException::InvalidInputException(pIVar11,(string *)local_198);
              __cxa_throw(pIVar11,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            uVar13 = 0;
            local_158.child.internal.
            super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
            do {
              GetArrowLogicalType((ArrowType *)local_198,config,schema->children[uVar13]);
              ::std::
              vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,true>>
                        ((vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                          *)local_1b8,
                         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                          *)local_198);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                ::std::default_delete<duckdb::ArrowType>::operator()
                          ((default_delete<duckdb::ArrowType> *)local_198,
                           (ArrowType *)local_198._0_8_);
              }
              pAVar2 = schema->children[uVar13];
              pvVar8 = vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true>::back
                                 ((vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> *)
                                  local_1b8);
              pAVar9 = shared_ptr<duckdb::ArrowType,_true>::operator->(pvVar8);
              GetDuckType((LogicalType *)local_198,pAVar9,false);
              ::std::
              vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              ::emplace_back<char_const*&,duckdb::LogicalType>
                        ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                          *)local_178,&pAVar2->name,(LogicalType *)local_198);
              LogicalType::~LogicalType((LogicalType *)local_198);
              uVar13 = uVar13 + 1;
            } while (uVar13 < (ulong)schema->n_children);
            make_uniq<duckdb::ArrowStructInfo,duckdb::vector<duckdb::shared_ptr<duckdb::ArrowType,true>,true>>
                      ((duckdb *)&local_158,
                       (vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> *)local_1b8);
            local_68.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_178._0_8_;
            local_68.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_178._8_8_;
            local_68.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_168._0_8_;
            local_178._0_8_ = (ArrowType *)0x0;
            local_178._8_8_ = (element_type *)0x0;
            local_168._0_8_ = 0;
            LogicalType::STRUCT((LogicalType *)local_198,&local_68);
            this = (ArrowType *)
                   local_158.child.internal.
                   super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowStructInfo,std::default_delete<duckdb::ArrowStructInfo>,true>>
                      ((duckdb *)
                       local_158.child.internal.
                       super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi,(LogicalType *)local_198,
                       (unique_ptr<duckdb::ArrowStructInfo,_std::default_delete<duckdb::ArrowStructInfo>,_true>
                        *)&local_158);
            LogicalType::~LogicalType((LogicalType *)local_198);
            ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                       *)&local_68);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_158.super_ArrowTypeInfo._vptr_ArrowTypeInfo !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              (**(code **)(*local_158.super_ArrowTypeInfo._vptr_ArrowTypeInfo + 8))();
            }
            ::std::
            vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
            ::~vector((vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                       *)local_1b8);
            this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                       *)local_178;
          }
          else {
            pcVar1 = (format->_M_dataplus)._M_p;
            if ((*pcVar1 == '+') && (pcVar1[1] == 'u')) {
              if (pcVar1[2] != 's') {
                pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
                local_198._0_8_ = &local_188;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_198,"Unsupported Internal Arrow Type: \"%c\" Union","");
                NotImplementedException::NotImplementedException<char>
                          (pNVar10,(string *)local_198,(format->_M_dataplus)._M_p[2]);
                __cxa_throw(pNVar10,&NotImplementedException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              local_198._0_8_ = &local_188;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"+us:","");
              ::std::__cxx11::string::substr((ulong)local_178,(ulong)format);
              StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)local_1b8,(string *)local_178,',');
              if ((ArrowType *)local_178._0_8_ != (ArrowType *)local_168) {
                operator_delete((void *)local_178._0_8_);
              }
              local_158.child.internal.
              super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_158.super_ArrowTypeInfo._vptr_ArrowTypeInfo = (_func_int **)0x0;
              local_158.super_ArrowTypeInfo._8_8_ = (_Head_base<0UL,_duckdb::ArrowType_*,_false>)0x0
              ;
              local_128._M_allocated_capacity = 0;
              local_138._M_allocated_capacity = 0;
              local_138._8_8_ = 0;
              if (schema->n_children == 0) {
                local_158.child.internal.
                super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
                pIVar11 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                local_178._0_8_ = (ArrowType *)local_168;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_178,
                           "Attempted to convert a UNION with no fields to DuckDB which is not supported"
                           ,"");
                InvalidInputException::InvalidInputException(pIVar11,(string *)local_178);
                __cxa_throw(pIVar11,&InvalidInputException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              uVar13 = 0;
              local_158.child.internal.
              super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
              do {
                pAVar2 = schema->children[uVar13];
                GetArrowLogicalType((ArrowType *)local_178,config,pAVar2);
                ::std::
                vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,true>>
                          ((vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                            *)local_138._M_local_buf,
                           (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                            *)local_178);
                if ((ArrowType *)local_178._0_8_ != (ArrowType *)0x0) {
                  ::std::default_delete<duckdb::ArrowType>::operator()
                            ((default_delete<duckdb::ArrowType> *)local_178,
                             (ArrowType *)local_178._0_8_);
                }
                pvVar8 = vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true>::back
                                   ((vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> *)
                                    &local_138);
                pAVar9 = shared_ptr<duckdb::ArrowType,_true>::operator->(pvVar8);
                GetDuckType((LogicalType *)local_178,pAVar9,false);
                ::std::
                vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                ::emplace_back<char_const*&,duckdb::LogicalType>
                          ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                            *)&local_158,&pAVar2->name,(LogicalType *)local_178);
                LogicalType::~LogicalType((LogicalType *)local_178);
                uVar13 = uVar13 + 1;
              } while (uVar13 < (ulong)schema->n_children);
              make_uniq<duckdb::ArrowStructInfo,duckdb::vector<duckdb::shared_ptr<duckdb::ArrowType,true>,true>>
                        ((duckdb *)local_1a0,
                         (vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> *)&local_138);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        *)&local_a0,
                       (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        *)&local_158);
              this = (ArrowType *)
                     local_158.child.internal.
                     super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
              LogicalType::UNION((LogicalType *)local_178,&local_a0);
              make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowStructInfo,std::default_delete<duckdb::ArrowStructInfo>,true>>
                        ((duckdb *)this,(LogicalType *)local_178,
                         (unique_ptr<duckdb::ArrowStructInfo,_std::default_delete<duckdb::ArrowStructInfo>,_true>
                          *)local_1a0);
              LogicalType::~LogicalType((LogicalType *)local_178);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         *)&local_a0);
              if (local_1a0 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_1a0 + 8))();
              }
              ::std::
              vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
              ::~vector((vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                         *)&local_138);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         *)&local_158);
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8);
              goto LAB_0115ef70;
            }
            iVar6 = ::std::__cxx11::string::compare((char *)format);
            if (iVar6 != 0) {
              iVar6 = ::std::__cxx11::string::compare((char *)format);
              if (iVar6 != 0) {
                pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
                local_198._0_8_ = &local_188;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_198,"Unsupported Internal Arrow Type %s","");
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                pcVar4 = (format->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_50,pcVar4,pcVar4 + format->_M_string_length);
                NotImplementedException::NotImplementedException<std::__cxx11::string>
                          (pNVar10,(string *)local_198,&local_50);
                __cxa_throw(pNVar10,&NotImplementedException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              pAVar2 = *schema->children;
              GetArrowLogicalType((ArrowType *)&local_138,config,*pAVar2->children);
              GetArrowLogicalType((ArrowType *)local_1a0,config,pAVar2->children[1]);
              local_178._0_8_ = (pointer)0x0;
              local_178._8_8_ = (element_type *)0x0;
              local_168._0_8_ = 0;
              pAVar7 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::
                       operator->((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                   *)&local_138._M_allocated_capacity);
              GetDuckType((LogicalType *)local_1b8,pAVar7,false);
              local_198._0_8_ = "key";
              LogicalType::LogicalType((LogicalType *)(local_198 + 8),(LogicalType *)local_1b8);
              ::std::
              vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              ::emplace_back<std::pair<char_const*,duckdb::LogicalType>>
                        ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                          *)local_178,(pair<const_char_*,_duckdb::LogicalType> *)local_198);
              LogicalType::~LogicalType((LogicalType *)(local_198 + 8));
              LogicalType::~LogicalType((LogicalType *)local_1b8);
              pAVar7 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::
                       operator->((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                   *)local_1a0);
              GetDuckType((LogicalType *)local_1b8,pAVar7,false);
              local_198._0_8_ = "value";
              LogicalType::LogicalType((LogicalType *)(local_198 + 8),(LogicalType *)local_1b8);
              ::std::
              vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              ::emplace_back<std::pair<char_const*,duckdb::LogicalType>>
                        ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                          *)local_178,(pair<const_char_*,_duckdb::LogicalType> *)local_198);
              LogicalType::~LogicalType((LogicalType *)(local_198 + 8));
              LogicalType::~LogicalType((LogicalType *)local_1b8);
              pAVar7 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::
                       operator->((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                   *)&local_138._M_allocated_capacity);
              GetDuckType(&local_d0,pAVar7,false);
              pAVar7 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::
                       operator->((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                   *)local_1a0);
              GetDuckType(&local_e8,pAVar7,false);
              LogicalType::MAP((LogicalType *)local_198,&local_d0,&local_e8);
              LogicalType::~LogicalType(&local_e8);
              LogicalType::~LogicalType(&local_d0);
              local_1b8._0_8_ =
                   (tuple<duckdb::ArrowArrayInfo_*,_std::default_delete<duckdb::ArrowArrayInfo>_>)
                   0x0;
              local_1b8._8_8_ = (element_type *)0x0;
              local_1b8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              ::std::
              vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
              ::reserve((vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                         *)local_1b8,2);
              ::std::__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,void>
                        ((__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2> *)&local_158,
                         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)
                         &local_138._M_allocated_capacity);
              ::std::
              vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
              ::emplace_back<duckdb::shared_ptr<duckdb::ArrowType,true>>
                        ((vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                          *)local_1b8,(shared_ptr<duckdb::ArrowType,_true> *)&local_158);
              if ((_Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>)
                  local_158.super_ArrowTypeInfo._8_8_ != (ArrowType *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_158.super_ArrowTypeInfo._8_8_);
              }
              ::std::__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,void>
                        ((__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2> *)&local_158,
                         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)
                         local_1a0);
              ::std::
              vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
              ::emplace_back<duckdb::shared_ptr<duckdb::ArrowType,true>>
                        ((vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                          *)local_1b8,(shared_ptr<duckdb::ArrowType,_true> *)&local_158);
              if ((_Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>)
                  local_158.super_ArrowTypeInfo._8_8_ != (ArrowType *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_158.super_ArrowTypeInfo._8_8_);
              }
              local_88.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_178._0_8_;
              local_88.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_178._8_8_;
              local_88.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_168._0_8_;
              local_178._0_8_ = (ArrowType *)0x0;
              local_178._8_8_ = (element_type *)0x0;
              local_168._0_8_ = 0;
              LogicalType::STRUCT((LogicalType *)&local_158,&local_88);
              make_uniq<duckdb::ArrowStructInfo,duckdb::vector<duckdb::shared_ptr<duckdb::ArrowType,true>,true>>
                        ((duckdb *)&local_108,
                         (vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> *)local_1b8);
              make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowStructInfo,std::default_delete<duckdb::ArrowStructInfo>,true>>
                        ((duckdb *)local_118,(LogicalType *)&local_158,
                         (unique_ptr<duckdb::ArrowStructInfo,_std::default_delete<duckdb::ArrowStructInfo>,_true>
                          *)&local_108);
              if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                (*(local_108._M_pi)->_vptr__Sp_counted_base[1])();
              }
              LogicalType::~LogicalType((LogicalType *)&local_158);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         *)&local_88);
              ::std::__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,void>
                        ((__shared_ptr<duckdb::ArrowType,(__gnu_cxx::_Lock_policy)2> *)&local_100,
                         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)
                         local_118);
              ArrowListInfo::List(&local_158,&local_100,NORMAL);
              if ((element_type *)
                  local_100.internal.
                  super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_100.internal.
                           super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              make_uniq<duckdb::ArrowType,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::ArrowListInfo,std::default_delete<duckdb::ArrowListInfo>,true>>
                        ((duckdb *)this,(LogicalType *)local_198,
                         (unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>,_true>
                          *)&local_158);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_158.super_ArrowTypeInfo._vptr_ArrowTypeInfo !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                (**(code **)(*local_158.super_ArrowTypeInfo._vptr_ArrowTypeInfo + 8))();
              }
              if (local_118 != (undefined1  [8])0x0) {
                ::std::default_delete<duckdb::ArrowType>::operator()
                          ((default_delete<duckdb::ArrowType> *)local_118,(ArrowType *)local_118);
              }
              ::std::
              vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
              ::~vector((vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                         *)local_1b8);
              LogicalType::~LogicalType((LogicalType *)local_198);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         *)local_178);
              if ((tuple<duckdb::ArrowStructInfo_*,_std::default_delete<duckdb::ArrowStructInfo>_>)
                  local_1a0 != (_Head_base<0UL,_duckdb::ArrowStructInfo_*,_false>)0x0) {
                ::std::default_delete<duckdb::ArrowType>::operator()
                          ((default_delete<duckdb::ArrowType> *)local_1a0,(ArrowType *)local_1a0);
              }
              if ((ArrowType *)local_138._M_allocated_capacity != (ArrowType *)0x0) {
                ::std::default_delete<duckdb::ArrowType>::operator()
                          ((default_delete<duckdb::ArrowType> *)local_138._M_local_buf,
                           (ArrowType *)local_138._M_allocated_capacity);
              }
              goto LAB_0115ed57;
            }
            local_198._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_198._8_8_ = (_Head_base<0UL,_duckdb::ArrowType_*,_false>)0x0;
            local_188._M_allocated_capacity = 0;
            local_168._0_8_ = 0;
            local_178._0_8_ = (ArrowType *)0x0;
            local_178._8_8_ = (element_type *)0x0;
            lVar3 = schema->n_children;
            local_158.child.internal.
            super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
            if (lVar3 != 0) {
              lVar14 = 0;
              do {
                pAVar2 = schema->children[lVar14];
                GetArrowLogicalType((ArrowType *)local_1b8,config,pAVar2);
                ::std::
                vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::ArrowType,std::default_delete<duckdb::ArrowType>,true>>
                          ((vector<duckdb::shared_ptr<duckdb::ArrowType,true>,std::allocator<duckdb::shared_ptr<duckdb::ArrowType,true>>>
                            *)local_178,
                           (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                            *)local_1b8);
                if ((ClientContext *)local_1b8._0_8_ != (ClientContext *)0x0) {
                  ::std::default_delete<duckdb::ArrowType>::operator()
                            ((default_delete<duckdb::ArrowType> *)local_1b8,
                             (ArrowType *)local_1b8._0_8_);
                }
                pvVar8 = vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true>::back
                                   ((vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> *)
                                    local_178);
                pAVar9 = shared_ptr<duckdb::ArrowType,_true>::operator->(pvVar8);
                GetDuckType((LogicalType *)local_1b8,pAVar9,false);
                ::std::
                vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                ::emplace_back<char_const*&,duckdb::LogicalType>
                          ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                            *)local_198,&pAVar2->name,(LogicalType *)local_1b8);
                LogicalType::~LogicalType((LogicalType *)local_1b8);
                lVar14 = lVar14 + 1;
              } while (lVar3 != lVar14);
            }
            make_uniq<duckdb::ArrowStructInfo,duckdb::vector<duckdb::shared_ptr<duckdb::ArrowType,true>,true>>
                      ((duckdb *)&local_158,
                       (vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true> *)local_178);
            ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                      *)&local_b8,
                     (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                      *)local_198);
            this = (ArrowType *)
                   local_158.child.internal.
                   super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            LogicalType::STRUCT((LogicalType *)local_1b8,&local_b8);
            make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowStructInfo,std::default_delete<duckdb::ArrowStructInfo>,true>>
                      ((duckdb *)this,(LogicalType *)local_1b8,
                       (unique_ptr<duckdb::ArrowStructInfo,_std::default_delete<duckdb::ArrowStructInfo>,_true>
                        *)&local_158);
            LogicalType::~LogicalType((LogicalType *)local_1b8);
            ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                       *)&local_b8);
            pAVar7 = unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>::
                     operator->((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                 *)this);
            SetRunEndEncoded(pAVar7);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_158.super_ArrowTypeInfo._vptr_ArrowTypeInfo !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              (**(code **)(*local_158.super_ArrowTypeInfo._vptr_ArrowTypeInfo + 8))();
            }
            ::std::
            vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
            ::~vector((vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>
                       *)local_178);
            this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                       *)local_198;
          }
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::~vector(this_00);
        }
        goto LAB_0115ed57;
      }
    }
  }
  CreateListType(this,config,*schema->children,size_type,view);
LAB_0115ed57:
  if (local_110 != (undefined1  [8])0x0) {
    ::std::default_delete<duckdb::ArrowType>::operator()
              ((default_delete<duckdb::ArrowType> *)local_110,(ArrowType *)local_110);
  }
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (_Tuple_impl<0UL,_duckdb::ArrowType_*,_std::default_delete<duckdb::ArrowType>_>)this;
}

Assistant:

unique_ptr<ArrowType> ArrowType::GetTypeFromFormat(DBConfig &config, ArrowSchema &schema, string &format) {
	auto type = GetTypeFromFormat(format);
	if (type) {
		return type;
	}
	if (format == "+l") {
		return CreateListType(config, *schema.children[0], ArrowVariableSizeType::NORMAL, false);
	} else if (format == "+L") {
		return CreateListType(config, *schema.children[0], ArrowVariableSizeType::SUPER_SIZE, false);
	} else if (format == "+vl") {
		return CreateListType(config, *schema.children[0], ArrowVariableSizeType::NORMAL, true);
	} else if (format == "+vL") {
		return CreateListType(config, *schema.children[0], ArrowVariableSizeType::SUPER_SIZE, true);
	} else if (format[0] == '+' && format[1] == 'w') {
		std::string parameters = format.substr(format.find(':') + 1);
		auto fixed_size = NumericCast<idx_t>(std::stoi(parameters));
		auto child_type = GetArrowLogicalType(config, *schema.children[0]);

		auto array_type = LogicalType::ARRAY(child_type->GetDuckType(), fixed_size);
		auto type_info = make_uniq<ArrowArrayInfo>(std::move(child_type), fixed_size);
		return make_uniq<ArrowType>(array_type, std::move(type_info));
	} else if (format == "+s") {
		child_list_t<LogicalType> child_types;
		vector<shared_ptr<ArrowType>> children;
		if (schema.n_children == 0) {
			throw InvalidInputException(
			    "Attempted to convert a STRUCT with no fields to DuckDB which is not supported");
		}
		for (idx_t type_idx = 0; type_idx < static_cast<idx_t>(schema.n_children); type_idx++) {
			children.emplace_back(GetArrowLogicalType(config, *schema.children[type_idx]));
			child_types.emplace_back(schema.children[type_idx]->name, children.back()->GetDuckType());
		}
		auto type_info = make_uniq<ArrowStructInfo>(std::move(children));
		auto struct_type = make_uniq<ArrowType>(LogicalType::STRUCT(std::move(child_types)), std::move(type_info));
		return struct_type;
	} else if (format[0] == '+' && format[1] == 'u') {
		if (format[2] != 's') {
			throw NotImplementedException("Unsupported Internal Arrow Type: \"%c\" Union", format[2]);
		}
		D_ASSERT(format[3] == ':');

		std::string prefix = "+us:";
		// TODO: what are these type ids actually for?
		auto type_ids = StringUtil::Split(format.substr(prefix.size()), ',');

		child_list_t<LogicalType> members;
		vector<shared_ptr<ArrowType>> children;
		if (schema.n_children == 0) {
			throw InvalidInputException("Attempted to convert a UNION with no fields to DuckDB which is not supported");
		}
		for (idx_t type_idx = 0; type_idx < static_cast<idx_t>(schema.n_children); type_idx++) {
			auto type = schema.children[type_idx];

			children.emplace_back(GetArrowLogicalType(config, *type));
			members.emplace_back(type->name, children.back()->GetDuckType());
		}

		auto type_info = make_uniq<ArrowStructInfo>(std::move(children));
		auto union_type = make_uniq<ArrowType>(LogicalType::UNION(members), std::move(type_info));
		return union_type;
	} else if (format == "+r") {
		child_list_t<LogicalType> members;
		vector<shared_ptr<ArrowType>> children;
		idx_t n_children = static_cast<idx_t>(schema.n_children);
		D_ASSERT(n_children == 2);
		D_ASSERT(string(schema.children[0]->name) == "run_ends");
		D_ASSERT(string(schema.children[1]->name) == "values");
		for (idx_t i = 0; i < n_children; i++) {
			auto type = schema.children[i];
			children.emplace_back(GetArrowLogicalType(config, *type));
			members.emplace_back(type->name, children.back()->GetDuckType());
		}

		auto type_info = make_uniq<ArrowStructInfo>(std::move(children));
		auto struct_type = make_uniq<ArrowType>(LogicalType::STRUCT(members), std::move(type_info));
		struct_type->SetRunEndEncoded();
		return struct_type;
	} else if (format == "+m") {
		auto &arrow_struct_type = *schema.children[0];
		D_ASSERT(arrow_struct_type.n_children == 2);
		auto key_type = GetArrowLogicalType(config, *arrow_struct_type.children[0]);
		auto value_type = GetArrowLogicalType(config, *arrow_struct_type.children[1]);
		child_list_t<LogicalType> key_value;
		key_value.emplace_back(std::make_pair("key", key_type->GetDuckType()));
		key_value.emplace_back(std::make_pair("value", value_type->GetDuckType()));

		auto map_type = LogicalType::MAP(key_type->GetDuckType(), value_type->GetDuckType());
		vector<shared_ptr<ArrowType>> children;
		children.reserve(2);
		children.push_back(std::move(key_type));
		children.push_back(std::move(value_type));
		auto inner_struct = make_uniq<ArrowType>(LogicalType::STRUCT(std::move(key_value)),
		                                         make_uniq<ArrowStructInfo>(std::move(children)));
		auto map_type_info = ArrowListInfo::List(std::move(inner_struct), ArrowVariableSizeType::NORMAL);
		return make_uniq<ArrowType>(map_type, std::move(map_type_info));
	}
	throw NotImplementedException("Unsupported Internal Arrow Type %s", format);
}